

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCSM.cpp
# Opt level: O0

NaPNEvent __thiscall NaControlSystemModel::run_net(NaControlSystemModel *this)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  long *plVar5;
  long *in_RDI;
  NaException *ex;
  NaPNEvent pnev;
  NaVector rAux;
  NaVector rMain;
  NaPNEvent local_54;
  NaVector local_50 [40];
  NaVector local_28 [36];
  NaPNEvent local_4;
  
  plVar5 = (long *)NaPetriCnInput::data();
  uVar4 = (**(code **)(*plVar5 + 0x30))();
  NaVector::NaVector(local_28,uVar4);
  plVar5 = (long *)NaPetriCnInput::data();
  uVar4 = (**(code **)(*plVar5 + 0x30))();
  NaVector::NaVector(local_50,uVar4);
  NaVector::init_value(1.0);
  NaVector::init_value(-1.0);
  NaPetriCnOutput::set_starter((NaVector *)(in_RDI + 0x94));
  NaPNSum::set_gain((NaVector *)(in_RDI + 0x23b),local_28);
  NaPetriNet::set_timing_node((NaPetriNode *)(in_RDI + 1));
  cVar1 = (char)in_RDI;
  bVar3 = NaPetriNet::prepare((bool)(cVar1 + '\b'));
  if ((bVar3 & 1) == 0) {
    NaPrintLog("IMPORTANT: verification failed!\n");
    bVar2 = false;
  }
  else {
    do {
      local_54 = NaPetriNet::step_alive((bool)(cVar1 + '\b'));
      (**(code **)(*in_RDI + 0x28))();
      if ((*(int *)((long)in_RDI + 0x40f4) != 0) &&
         (uVar4 = NaPetriNode::activations(), *(uint *)((long)in_RDI + 0x40f4) < uVar4)) {
        local_54 = pneDead;
      }
      bVar3 = (**(code **)(*in_RDI + 0x20))();
      if ((bVar3 & 1) != 0) {
        local_54 = pneTerminate;
      }
    } while (local_54 == pneAlive);
    NaPetriNet::terminate((bool)(cVar1 + '\b'));
    local_4 = local_54;
    bVar2 = true;
  }
  NaVector::~NaVector(local_50);
  NaVector::~NaVector(local_28);
  if (!bVar2) {
    local_4 = pneError;
  }
  return local_4;
}

Assistant:

NaPNEvent
NaControlSystemModel::run_net ()
{
    try{
	NaVector	rMain(onsum.main.data().dim());
	NaVector	rAux(onsum.aux.data().dim());
	rMain.init_value(1.);
	rAux.init_value(-1.);

	cmp.cmp.set_starter(vInitial);
	onsum.set_gain(rMain, rAux);

	net.set_timing_node((NaPetriNode*)&cmp);

        // Prepare petri net engine
        if(!net.prepare()){
            NaPrintLog("IMPORTANT: verification failed!\n");
        }
        else{
            NaPNEvent       pnev;

#if defined(__MSDOS__) || defined(__WIN32__)
            printf("Press 'q' or 'x' for exit\n");
#endif /* DOS & Win */

            // Activities cycle
            do{
                pnev = net.step_alive();

                idle_entry();

		if(0 != nSeriesLen && setpnt_gen.activations() > nSeriesLen)
		    pnev = pneDead;

                if(user_break())
                    pnev = pneTerminate;

            }while(pneAlive == pnev);

            net.terminate();

            return pnev;
        }
    }
    catch(NaException& ex){
        NaPrintLog("EXCEPTION at runtime phase: %s\n", NaExceptionMsg(ex));
    }
    return pneError;
}